

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_libc.c
# Opt level: O0

err_t Read(filestream *p,void *Data,size_t Size,size_t *Readed)

{
  size_t local_40;
  ssize_t n;
  err_t Err;
  size_t *Readed_local;
  size_t Size_local;
  void *Data_local;
  filestream *p_local;
  
  if (Size < 0x8000000000000000) {
    local_40 = read(p->fd,Data,Size);
    if ((long)local_40 < 0) {
      local_40 = 0;
      n = -0x15;
    }
    else {
      n = 0;
      if (local_40 != Size) {
        n = -9;
      }
    }
    if (Readed != (size_t *)0x0) {
      *Readed = local_40;
    }
    p_local = (filestream *)n;
  }
  else {
    p_local = (filestream *)0xffffffffffffffeb;
  }
  return (err_t)p_local;
}

Assistant:

static err_t Read(filestream* p,void* Data,size_t Size,size_t* Readed)
{
    if (Size > SSIZE_MAX)
        return ERR_READ;
    err_t Err;
    ssize_t n = read(p->fd, Data, Size);
    if (n<0)
    {
        n=0;
        Err = ERR_READ;
    }
    else
        Err = (n != (ssize_t)Size) ? ERR_END_OF_FILE:ERR_NONE;

    if (Readed)
        *Readed = n;
    return Err;
}